

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  bool *pbVar1;
  bool *pbVar2;
  long *plVar3;
  Expr<tcu::Matrix<float,_2,_2>_> *pEVar4;
  double dVar5;
  pointer pSVar6;
  Interval *pIVar7;
  Interval *pIVar8;
  long lVar9;
  ulong uVar10;
  undefined1 *puVar11;
  long lVar12;
  bool bVar13;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  _Stack_108;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  YesNoMaybe YStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  Precision local_b0;
  undefined1 *local_a8;
  int local_a0;
  undefined1 local_90 [96];
  
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_108._M_impl.super__Rb_tree_header._M_header;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  initialize(this);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&_Stack_108,
             (this->m_var0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             args->a);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->b);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->c);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->d);
  local_b0 = ctx->floatPrecision;
  local_a0 = ctx->callDepth;
  local_b8 = (ctx->format).m_maxValue;
  local_d8 = (ctx->format).m_minExp;
  iStack_d4 = (ctx->format).m_maxExp;
  iStack_d0 = (ctx->format).m_fractionBits;
  YStack_cc = (ctx->format).m_hasSubnormal;
  local_c8._0_4_ = (ctx->format).m_hasInf;
  local_c8._4_4_ = (ctx->format).m_hasNaN;
  uStack_c0 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  pSVar6 = (this->m_body).
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (undefined1 *)&_Stack_108;
  if ((this->m_body).
      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    lVar12 = 0;
    uVar10 = 0;
    local_a8 = (undefined1 *)&_Stack_108;
    do {
      plVar3 = *(long **)((long)&(pSVar6->super_SharedPtr<const_vkt::shaderexecutor::Statement>).
                                 m_ptr + lVar12);
      (**(code **)(*plVar3 + 0x18))(plVar3,&local_d8);
      uVar10 = uVar10 + 1;
      pSVar6 = (this->m_body).
               super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x10;
    } while (uVar10 < (ulong)((long)(this->m_body).
                                    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 4))
    ;
  }
  pEVar4 = (this->m_ret).super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr;
  puVar11 = local_90;
  (*(pEVar4->super_ExprBase)._vptr_ExprBase[4])(puVar11,pEVar4,&local_d8);
  pIVar7 = (Interval *)__return_storage_ptr__;
  lVar12 = 0;
  do {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&pIVar7->m_hi + lVar9) = *(undefined8 *)(puVar11 + lVar9 + 0x10);
      dVar5 = *(double *)((long)(puVar11 + lVar9) + 8);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar7->m_hasNaN)->m_data[0].m_data[0]
                .m_hasNaN + lVar9;
      *(undefined8 *)pbVar1 = *(undefined8 *)(puVar11 + lVar9);
      *(double *)(pbVar1 + 8) = dVar5;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 == 0x30);
    pIVar7 = pIVar7 + 1;
    puVar11 = puVar11 + 0x18;
    bVar13 = lVar12 == 0;
    lVar12 = lVar12 + 1;
  } while (bVar13);
  pIVar8 = (Interval *)
           Environment::lookup<tcu::Matrix<float,2,2>>
                     ((Environment *)&_Stack_108,
                      (this->m_var0).
                      super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                      .m_ptr);
  pIVar7 = (Interval *)args->a;
  lVar12 = 0;
  do {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&pIVar7->m_hi + lVar9) = *(undefined8 *)((long)&pIVar8->m_hi + lVar9);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar8->m_hasNaN)->m_data[0].m_data[0]
                .m_hasNaN + lVar9;
      dVar5 = *(double *)(pbVar1 + 8);
      pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar7->m_hasNaN)->m_data[0].m_data[0]
                .m_hasNaN + lVar9;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar5;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 == 0x30);
    pIVar7 = pIVar7 + 1;
    pIVar8 = pIVar8 + 1;
    bVar13 = lVar12 == 0;
    lVar12 = lVar12 + 1;
  } while (bVar13);
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&_Stack_108);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}